

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fFboCompletenessTests.cpp
# Opt level: O3

IterateResult __thiscall
deqp::gles3::Functional::NumSamplesTest::build(NumSamplesTest *this,FboBuilder *builder)

{
  int iVar1;
  GLenum attPoint;
  uint uVar2;
  _Rb_tree<deqp::gls::FboUtil::config::Config*,deqp::gls::FboUtil::config::Config*,std::_Identity<deqp::gls::FboUtil::config::Config*>,std::less<deqp::gls::FboUtil::config::Config*>,std::allocator<deqp::gls::FboUtil::config::Config*>>
  *this_00;
  GLuint GVar3;
  Renderbuffer *pRVar4;
  NotSupportedError *this_01;
  ImageFormat format;
  long lVar5;
  Renderbuffer *local_48;
  TestBase *local_40;
  _Rb_tree<deqp::gls::FboUtil::config::Config*,deqp::gls::FboUtil::config::Config*,std::_Identity<deqp::gls::FboUtil::config::Config*>,std::less<deqp::gls::FboUtil::config::Config*>,std::allocator<deqp::gls::FboUtil::config::Config*>>
  *local_38;
  
  local_38 = (_Rb_tree<deqp::gls::FboUtil::config::Config*,deqp::gls::FboUtil::config::Config*,std::_Identity<deqp::gls::FboUtil::config::Config*>,std::less<deqp::gls::FboUtil::config::Config*>,std::allocator<deqp::gls::FboUtil::config::Config*>>
              *)&builder->m_configs;
  lVar5 = 0;
  local_40 = (TestBase *)this;
  do {
    this_00 = local_38;
    iVar1 = *(int *)((long)&(((TestBase *)((long)this + 0x78))->super_TestCase).super_TestNode.
                            _vptr_TestNode + lVar5);
    if (iVar1 != -2) {
      attPoint = *(GLenum *)((long)build::s_targets + lVar5);
      uVar2 = *(uint *)((long)build::s_formats + lVar5);
      format.unsizedType = 0;
      format.format = uVar2;
      if (iVar1 == -1) {
        deqp::gls::fboc::details::TestBase::attachTargetToNew
                  ((TestBase *)this,attPoint,0x1702,format,0x40,0x40,builder);
      }
      else {
        pRVar4 = (Renderbuffer *)operator_new(0x20);
        (pRVar4->super_Image).internalFormat.format = 0;
        (pRVar4->super_Image).internalFormat.unsizedType = 0;
        (pRVar4->super_Image).width = 0;
        (pRVar4->super_Image).height = 0;
        (pRVar4->super_Image).super_Config._vptr_Config = (_func_int **)&PTR__Config_021491e8;
        pRVar4->numSamples = 0;
        local_48 = pRVar4;
        std::
        _Rb_tree<deqp::gls::FboUtil::config::Config*,deqp::gls::FboUtil::config::Config*,std::_Identity<deqp::gls::FboUtil::config::Config*>,std::less<deqp::gls::FboUtil::config::Config*>,std::allocator<deqp::gls::FboUtil::config::Config*>>
        ::_M_insert_unique<deqp::gls::FboUtil::config::Config*>(this_00,(Config **)&local_48);
        (pRVar4->super_Image).internalFormat.format = uVar2;
        *(undefined8 *)&(pRVar4->super_Image).internalFormat.unsizedType = 0x4000000000;
        (pRVar4->super_Image).height = 0x40;
        pRVar4->numSamples = iVar1;
        GVar3 = deqp::gls::FboUtil::FboBuilder::glCreateRbo(builder,pRVar4);
        if (builder->m_error == 0x502) {
          this_01 = (NotSupportedError *)__cxa_allocate_exception(0x38);
          tcu::NotSupportedError::NotSupportedError
                    (this_01,"Unsupported number of samples",
                     "builder.getError() != GL_INVALID_OPERATION",
                     "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fFboCompletenessTests.cpp"
                     ,0x1a9);
          __cxa_throw(this_01,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
        }
        pRVar4 = (Renderbuffer *)operator_new(0x18);
        (pRVar4->super_Image).internalFormat.format = 0x8d40;
        (pRVar4->super_Image).internalFormat.unsizedType = 0;
        (pRVar4->super_Image).super_Config._vptr_Config = (_func_int **)&PTR__Config_02149220;
        (pRVar4->super_Image).width = 0x8d41;
        local_48 = pRVar4;
        std::
        _Rb_tree<deqp::gls::FboUtil::config::Config*,deqp::gls::FboUtil::config::Config*,std::_Identity<deqp::gls::FboUtil::config::Config*>,std::less<deqp::gls::FboUtil::config::Config*>,std::allocator<deqp::gls::FboUtil::config::Config*>>
        ::_M_insert_unique<deqp::gls::FboUtil::config::Config*>(this_00,(Config **)&local_48);
        (pRVar4->super_Image).internalFormat.unsizedType = GVar3;
        deqp::gls::FboUtil::FboBuilder::glAttach(builder,attPoint,(Attachment *)pRVar4);
        this = (NumSamplesTest *)local_40;
      }
    }
    lVar5 = lVar5 + 4;
  } while (lVar5 != 0xc);
  return STOP;
}

Assistant:

IterateResult NumSamplesTest::build (FboBuilder& builder)
{
	static const GLenum s_targets[] =
		{
			GL_COLOR_ATTACHMENT0,	GL_COLOR_ATTACHMENT1,	GL_DEPTH_ATTACHMENT,
		};
	// Non-integer formats for each attachment type.
	// \todo [2013-12-17 lauri] Add fixed/floating/integer metadata for formats so
	// we can pick one smartly or maybe try several.
	static const GLenum s_formats[] =
		{
			GL_RGBA8,				GL_RGB565,				GL_DEPTH_COMPONENT24,
		};
	DE_STATIC_ASSERT(DE_LENGTH_OF_ARRAY(s_targets) == DE_LENGTH_OF_ARRAY(m_params.numSamples));

	for (int i = 0; i < DE_LENGTH_OF_ARRAY(s_targets); i++)
	{
		const GLenum target = s_targets[i];
		const ImageFormat fmt = { s_formats[i], GL_NONE };

		const GLsizei ns = m_params.numSamples[i];
		if (ns == -2)
			continue;

		if (ns == -1)
		{
			attachTargetToNew(target, GL_TEXTURE, fmt, 64, 64, builder);
		}
		else
		{
			Renderbuffer& rboCfg = builder.makeConfig<Renderbuffer>();
			rboCfg.internalFormat = fmt;
			rboCfg.width = rboCfg.height = 64;
			rboCfg.numSamples = ns;

			const GLuint rbo = builder.glCreateRbo(rboCfg);
			// Implementations do not necessarily support sample sizes greater than 1.
			TCU_CHECK_AND_THROW(NotSupportedError,
								builder.getError() != GL_INVALID_OPERATION,
								"Unsupported number of samples");
			RenderbufferAttachment& att = builder.makeConfig<RenderbufferAttachment>();
			att.imageName = rbo;
			builder.glAttach(target, &att);
		}
	}

	return STOP;
}